

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# substitute.cc
# Opt level: O0

void __thiscall
absl::lts_20250127::substitute_internal::SubstituteAndAppendArray
          (substitute_internal *this,Nonnull<std::string_*> output,string_view format,
          Nullable<const_absl::string_view_*> args_array,size_t num_args)

{
  size_t sVar1;
  bool bVar2;
  uint uVar3;
  char *pcVar4;
  const_reference pvVar5;
  char *pcVar6;
  undefined8 uVar7;
  uchar *puVar8;
  size_type sVar9;
  unsigned_long uVar10;
  size_t *psVar11;
  const_iterator __first;
  const_iterator __last;
  long lVar12;
  long lVar13;
  string_view src_00;
  string_view src_01;
  string_view src_02;
  undefined1 local_190 [8];
  string_view src;
  size_t i_1;
  char *target;
  char *local_168;
  char *absl_raw_log_internal_filename;
  string local_158 [39];
  allocator<char> local_131;
  undefined1 local_130 [8];
  string death_message;
  size_t original_size;
  string local_f0;
  char *local_d0;
  char *absl_raw_log_internal_basename_2;
  size_t sStack_c0;
  string local_b0;
  char *local_90;
  char *absl_raw_log_internal_basename_1;
  int index;
  Nonnull<std::string_*> local_78;
  size_t sStack_70;
  string local_68;
  char *local_48;
  char *absl_raw_log_internal_basename;
  size_t i;
  size_t size;
  size_t num_args_local;
  Nullable<const_absl::string_view_*> args_array_local;
  Nonnull<std::string_*> output_local;
  string_view format_local;
  
  num_args_local = (size_t)format._M_str;
  format_local._M_len = format._M_len;
  i = 0;
  size = (size_t)args_array;
  args_array_local = (Nullable<const_absl::string_view_*>)this;
  output_local = output;
  for (absl_raw_log_internal_basename = (char *)0x0; pcVar6 = absl_raw_log_internal_basename,
      pcVar4 = (char *)std::basic_string_view<char,_std::char_traits<char>_>::size
                                 ((basic_string_view<char,_std::char_traits<char>_> *)&output_local)
      , pcVar6 < pcVar4; absl_raw_log_internal_basename = absl_raw_log_internal_basename + 1) {
    pvVar5 = std::basic_string_view<char,_std::char_traits<char>_>::operator[]
                       ((basic_string_view<char,_std::char_traits<char>_> *)&output_local,
                        (size_type)absl_raw_log_internal_basename);
    if (*pvVar5 == '$') {
      pcVar6 = absl_raw_log_internal_basename + 1;
      pcVar4 = (char *)std::basic_string_view<char,_std::char_traits<char>_>::size
                                 ((basic_string_view<char,_std::char_traits<char>_> *)&output_local)
      ;
      if (pcVar4 <= pcVar6) {
        local_48 = "substitute.cc";
        local_78 = output_local;
        sStack_70 = format_local._M_len;
        src_00._M_str = pcVar4;
        src_00._M_len = format_local._M_len;
        CEscape_abi_cxx11_(&local_68,(lts_20250127 *)output_local,src_00);
        uVar7 = std::__cxx11::string::c_str();
        raw_log_internal::RawLog
                  (kFatal,"substitute.cc",0x31,"Invalid absl::Substitute() format string: \"%s\".",
                   uVar7);
        std::__cxx11::string::~string((string *)&local_68);
        __assert_fail("false && \"ABSL_UNREACHABLE reached\"",
                      "/workspace/llm4binary/github/license_c_cmakelists/protocolbuffers[P]protobuf/build_O0/_deps/absl-src/absl/strings/substitute.cc"
                      ,0x31,
                      "void absl::substitute_internal::SubstituteAndAppendArray(absl::Nonnull<std::string *>, absl::string_view, absl::Nullable<const absl::string_view *>, size_t)"
                     );
      }
      puVar8 = (uchar *)std::basic_string_view<char,_std::char_traits<char>_>::operator[]
                                  ((basic_string_view<char,_std::char_traits<char>_> *)&output_local
                                   ,(size_type)(absl_raw_log_internal_basename + 1));
      bVar2 = ascii_isdigit(*puVar8);
      if (bVar2) {
        pvVar5 = std::basic_string_view<char,_std::char_traits<char>_>::operator[]
                           ((basic_string_view<char,_std::char_traits<char>_> *)&output_local,
                            (size_type)(absl_raw_log_internal_basename + 1));
        sVar1 = size;
        uVar3 = (int)*pvVar5 - 0x30;
        absl_raw_log_internal_basename_1._0_4_ = uVar3;
        if (size <= (ulong)(long)(int)uVar3) {
          local_90 = "substitute.cc";
          absl_raw_log_internal_basename_2 = (char *)output_local;
          sStack_c0 = format_local._M_len;
          src_01._M_str = pcVar4;
          src_01._M_len = format_local._M_len;
          CEscape_abi_cxx11_(&local_b0,(lts_20250127 *)output_local,src_01);
          uVar7 = std::__cxx11::string::c_str();
          raw_log_internal::RawLog
                    (kFatal,"substitute.cc",0x3e,
                     "Invalid absl::Substitute() format string: asked for \"$%d\", but only %d args were given.  Full format string was: \"%s\"."
                     ,(ulong)uVar3,sVar1 & 0xffffffff,uVar7);
          std::__cxx11::string::~string((string *)&local_b0);
          __assert_fail("false && \"ABSL_UNREACHABLE reached\"",
                        "/workspace/llm4binary/github/license_c_cmakelists/protocolbuffers[P]protobuf/build_O0/_deps/absl-src/absl/strings/substitute.cc"
                        ,0x3e,
                        "void absl::substitute_internal::SubstituteAndAppendArray(absl::Nonnull<std::string *>, absl::string_view, absl::Nullable<const absl::string_view *>, size_t)"
                       );
        }
        sVar9 = std::basic_string_view<char,_std::char_traits<char>_>::size
                          ((basic_string_view<char,_std::char_traits<char>_> *)
                           (num_args_local + (long)(int)uVar3 * 0x10));
        i = sVar9 + i;
      }
      else {
        pvVar5 = std::basic_string_view<char,_std::char_traits<char>_>::operator[]
                           ((basic_string_view<char,_std::char_traits<char>_> *)&output_local,
                            (size_type)(absl_raw_log_internal_basename + 1));
        if (*pvVar5 != '$') {
          local_d0 = "substitute.cc";
          src_02._M_str = pcVar4;
          src_02._M_len = format_local._M_len;
          CEscape_abi_cxx11_(&local_f0,(lts_20250127 *)output_local,src_02);
          uVar7 = std::__cxx11::string::c_str();
          raw_log_internal::RawLog
                    (kFatal,"substitute.cc",0x4b,"Invalid absl::Substitute() format string: \"%s\"."
                     ,uVar7);
          std::__cxx11::string::~string((string *)&local_f0);
          __assert_fail("false && \"ABSL_UNREACHABLE reached\"",
                        "/workspace/llm4binary/github/license_c_cmakelists/protocolbuffers[P]protobuf/build_O0/_deps/absl-src/absl/strings/substitute.cc"
                        ,0x4b,
                        "void absl::substitute_internal::SubstituteAndAppendArray(absl::Nonnull<std::string *>, absl::string_view, absl::Nullable<const absl::string_view *>, size_t)"
                       );
        }
        i = i + 1;
      }
      absl_raw_log_internal_basename = absl_raw_log_internal_basename + 1;
    }
    else {
      i = i + 1;
    }
  }
  if (i != 0) {
    death_message.field_2._8_8_ = std::__cxx11::string::size();
    sVar1 = i;
    uVar10 = std::numeric_limits<unsigned_long>::max();
    if (uVar10 - death_message.field_2._8_8_ < sVar1) {
      std::allocator<char>::allocator();
      std::__cxx11::string::string<std::allocator<char>>
                ((string *)local_130,
                 "Check size <= std::numeric_limits<size_t>::max() - original_size failed: ",
                 &local_131);
      std::allocator<char>::~allocator(&local_131);
      std::allocator<char>::allocator();
      std::__cxx11::string::string<std::allocator<char>>
                (local_158,"size_t overflow",
                 (allocator<char> *)((long)&absl_raw_log_internal_filename + 7));
      std::__cxx11::string::operator+=((string *)local_130,local_158);
      std::__cxx11::string::~string(local_158);
      std::allocator<char>::~allocator
                ((allocator<char> *)((long)&absl_raw_log_internal_filename + 7));
      local_168 = 
      "/workspace/llm4binary/github/license_c_cmakelists/protocolbuffers[P]protobuf/build_O0/_deps/absl-src/absl/strings/substitute.cc"
      ;
      target._4_4_ = 3;
      target._0_4_ = 0x5a;
      base_internal::
      AtomicHook<void(*)(absl::lts_20250127::LogSeverity,char_const*,int,std::__cxx11::string_const&)>
      ::operator()((AtomicHook<void(*)(absl::lts_20250127::LogSeverity,char_const*,int,std::__cxx11::string_const&)>
                    *)raw_log_internal::internal_log_function_abi_cxx11_,
                   (LogSeverity *)((long)&target + 4),&local_168,(int *)&target,
                   (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_130);
      __assert_fail("false && \"ABSL_UNREACHABLE reached\"",
                    "/workspace/llm4binary/github/license_c_cmakelists/protocolbuffers[P]protobuf/build_O0/_deps/absl-src/absl/strings/substitute.cc"
                    ,0x5a,
                    "void absl::substitute_internal::SubstituteAndAppendArray(absl::Nonnull<std::string *>, absl::string_view, absl::Nullable<const absl::string_view *>, size_t)"
                   );
    }
    strings_internal::STLStringResizeUninitializedAmortized<std::__cxx11::string>
              ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)args_array_local
               ,death_message.field_2._8_8_ + i);
    i_1 = std::__cxx11::string::operator[]((ulong)args_array_local);
    for (src._M_str = (char *)0x0; pcVar6 = src._M_str,
        pcVar4 = (char *)std::basic_string_view<char,_std::char_traits<char>_>::size
                                   ((basic_string_view<char,_std::char_traits<char>_> *)
                                    &output_local), pcVar6 < pcVar4; src._M_str = src._M_str + 1) {
      pvVar5 = std::basic_string_view<char,_std::char_traits<char>_>::operator[]
                         ((basic_string_view<char,_std::char_traits<char>_> *)&output_local,
                          (size_type)src._M_str);
      if (*pvVar5 == '$') {
        puVar8 = (uchar *)std::basic_string_view<char,_std::char_traits<char>_>::operator[]
                                    ((basic_string_view<char,_std::char_traits<char>_> *)
                                     &output_local,(size_type)(src._M_str + 1));
        bVar2 = ascii_isdigit(*puVar8);
        sVar1 = num_args_local;
        if (bVar2) {
          pvVar5 = std::basic_string_view<char,_std::char_traits<char>_>::operator[]
                             ((basic_string_view<char,_std::char_traits<char>_> *)&output_local,
                              (size_type)(src._M_str + 1));
          psVar11 = (size_t *)(sVar1 + (long)(*pvVar5 + -0x30) * 0x10);
          local_190 = (undefined1  [8])*psVar11;
          src._M_len = psVar11[1];
          __first = std::basic_string_view<char,_std::char_traits<char>_>::begin
                              ((basic_string_view<char,_std::char_traits<char>_> *)local_190);
          __last = std::basic_string_view<char,_std::char_traits<char>_>::end
                             ((basic_string_view<char,_std::char_traits<char>_> *)local_190);
          i_1 = (size_t)std::copy<char_const*,char*>(__first,__last,(char *)i_1);
          src._M_str = src._M_str + 1;
        }
        else {
          pvVar5 = std::basic_string_view<char,_std::char_traits<char>_>::operator[]
                             ((basic_string_view<char,_std::char_traits<char>_> *)&output_local,
                              (size_type)(src._M_str + 1));
          if (*pvVar5 == '$') {
            *(undefined1 *)i_1 = 0x24;
            src._M_str = src._M_str + 1;
            i_1 = i_1 + 1;
          }
        }
      }
      else {
        pvVar5 = std::basic_string_view<char,_std::char_traits<char>_>::operator[]
                           ((basic_string_view<char,_std::char_traits<char>_> *)&output_local,
                            (size_type)src._M_str);
        *(value_type *)i_1 = *pvVar5;
        i_1 = i_1 + 1;
      }
    }
    lVar12 = std::__cxx11::string::data();
    lVar13 = std::__cxx11::string::size();
    if (i_1 != lVar12 + lVar13) {
      __assert_fail("target == output->data() + output->size()",
                    "/workspace/llm4binary/github/license_c_cmakelists/protocolbuffers[P]protobuf/build_O0/_deps/absl-src/absl/strings/substitute.cc"
                    ,0x6d,
                    "void absl::substitute_internal::SubstituteAndAppendArray(absl::Nonnull<std::string *>, absl::string_view, absl::Nullable<const absl::string_view *>, size_t)"
                   );
    }
  }
  return;
}

Assistant:

void SubstituteAndAppendArray(
    absl::Nonnull<std::string*> output, absl::string_view format,
    absl::Nullable<const absl::string_view*> args_array, size_t num_args) {
  // Determine total size needed.
  size_t size = 0;
  for (size_t i = 0; i < format.size(); i++) {
    if (format[i] == '$') {
      if (i + 1 >= format.size()) {
#ifndef NDEBUG
        ABSL_RAW_LOG(FATAL,
                     "Invalid absl::Substitute() format string: \"%s\".",
                     absl::CEscape(format).c_str());
#endif
        return;
      } else if (absl::ascii_isdigit(
                     static_cast<unsigned char>(format[i + 1]))) {
        int index = format[i + 1] - '0';
        if (static_cast<size_t>(index) >= num_args) {
#ifndef NDEBUG
          ABSL_RAW_LOG(
              FATAL,
              "Invalid absl::Substitute() format string: asked for \"$"
              "%d\", but only %d args were given.  Full format string was: "
              "\"%s\".",
              index, static_cast<int>(num_args), absl::CEscape(format).c_str());
#endif
          return;
        }
        size += args_array[index].size();
        ++i;  // Skip next char.
      } else if (format[i + 1] == '$') {
        ++size;
        ++i;  // Skip next char.
      } else {
#ifndef NDEBUG
        ABSL_RAW_LOG(FATAL,
                     "Invalid absl::Substitute() format string: \"%s\".",
                     absl::CEscape(format).c_str());
#endif
        return;
      }
    } else {
      ++size;
    }
  }

  if (size == 0) return;

  // Build the string.
  size_t original_size = output->size();
  ABSL_INTERNAL_CHECK(
      size <= std::numeric_limits<size_t>::max() - original_size,
      "size_t overflow");
  strings_internal::STLStringResizeUninitializedAmortized(output,
                                                          original_size + size);
  char* target = &(*output)[original_size];
  for (size_t i = 0; i < format.size(); i++) {
    if (format[i] == '$') {
      if (absl::ascii_isdigit(static_cast<unsigned char>(format[i + 1]))) {
        const absl::string_view src = args_array[format[i + 1] - '0'];
        target = std::copy(src.begin(), src.end(), target);
        ++i;  // Skip next char.
      } else if (format[i + 1] == '$') {
        *target++ = '$';
        ++i;  // Skip next char.
      }
    } else {
      *target++ = format[i];
    }
  }

  assert(target == output->data() + output->size());
}